

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  WeightParamType WVar6;
  WeightParamType WVar7;
  WeightParamType WVar8;
  Result *_result;
  undefined1 *puVar9;
  undefined1 *puVar10;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string *local_a0;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  WeightParams *local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,2,2);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,2,2);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"SimpleRecurrent",(allocator<char> *)&err);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"SimpleRecurrent",(allocator<char> *)&local_78);
        validateRankCount(__return_storage_ptr__,layer,&err,5,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&err);
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (layer->_oneof_case_[0] == 400) {
        puVar9 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar9 = Specification::_SimpleRecurrentLayerParams_default_instance_;
      }
      bVar4 = ((PoolingLayerParams *)puVar9)->globalpooling_;
      puVar10 = (undefined1 *)((InnerProductLayerParams *)puVar9)->bias_;
      if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
        puVar10 = Specification::_WeightParams_default_instance_;
      }
      local_a0 = (string *)this_00;
      WVar6 = valueType((WeightParams *)puVar10);
      puVar10 = (undefined1 *)((BatchnormLayerParams *)puVar9)->mean_;
      if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
        puVar10 = Specification::_WeightParams_default_instance_;
      }
      WVar7 = valueType((WeightParams *)puVar10);
      puVar10 = (undefined1 *)((BatchnormLayerParams *)puVar9)->variance_;
      if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
        puVar10 = Specification::_WeightParams_default_instance_;
      }
      WVar8 = valueType((WeightParams *)puVar10);
      if (((WVar6 == UNSPECIFIED) || (WVar7 == UNSPECIFIED)) ||
         ((WVar8 == UNSPECIFIED & bVar4) != 0)) {
        std::operator+(&local_78,"Simple recurrent layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_78,"\' has invalid weightMatrix/recusionMatrix/Bias fields.");
        std::__cxx11::string::~string((string *)&local_78);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      else {
        if (((WVar6 == QUINT) || (WVar7 == QUINT)) ||
           ((WVar6 == WVar7 && (((WVar8 == QUINT || (WVar6 == WVar8)) || (bVar4 == false)))))) {
          local_58 = ((InnerProductLayerParams *)puVar9)->bias_;
          uVar1 = ((SimpleRecurrentLayerParams *)puVar9)->outputvectorsize_;
          if (local_58 == (WeightParams *)0x0) {
            local_58 = (WeightParams *)Specification::_WeightParams_default_instance_;
          }
          uVar2 = ((BatchnormLayerParams *)puVar9)->channels_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"SimpleRNN",&local_a1);
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"WeightMatrix",&local_a2);
          validateGeneralWeightParams
                    (__return_storage_ptr__,local_58,uVar2 * uVar1,uVar1,&err,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&err);
          bVar5 = Result::good(__return_storage_ptr__);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string(local_a0);
          puVar10 = (undefined1 *)((BatchnormLayerParams *)puVar9)->mean_;
          if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
            puVar10 = Specification::_WeightParams_default_instance_;
          }
          uVar1 = ((SimpleRecurrentLayerParams *)puVar9)->outputvectorsize_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"SimpleRNN",&local_a1);
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"RecursionMatrix",&local_a2);
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar10,uVar1 * uVar1,uVar1,&err,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&err);
          bVar5 = Result::good(__return_storage_ptr__);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string(local_a0);
          if (bVar4 != false) {
            puVar10 = (undefined1 *)((BatchnormLayerParams *)puVar9)->variance_;
            if ((WeightParams *)puVar10 == (WeightParams *)0x0) {
              puVar10 = Specification::_WeightParams_default_instance_;
            }
            uVar1 = ((SimpleRecurrentLayerParams *)puVar9)->outputvectorsize_;
            std::__cxx11::string::string<std::allocator<char>>((string *)&err,"SimpleRNN",&local_a1)
            ;
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"BiasVector",&local_a2);
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar10,uVar1,1,&err,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&err);
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            std::__cxx11::string::~string(local_a0);
          }
          if (layer->_oneof_case_[0] == 400) {
            puVar9 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar9 = Specification::_SimpleRecurrentLayerParams_default_instance_;
          }
          puVar9 = (undefined1 *)(((ActivationParams *)puVar9)->NonlinearityType_).linear_;
          if ((ActivationParams *)puVar9 == (ActivationParams *)0x0) {
            puVar9 = Specification::_ActivationParams_default_instance_;
          }
          validateRecurrentActivationParams(__return_storage_ptr__,(ActivationParams *)puVar9);
          return __return_storage_ptr__;
        }
        std::operator+(&local_78,"Simple recurrent layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_78,
                       "\' has invalid weightMatrix/recusionMatrix/Bias fields. Field value types should match and should either be half or full precision."
                      );
        std::__cxx11::string::~string((string *)&local_78);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      }
      std::__cxx11::string::~string((string *)&err);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden state
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank));
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                                                  params.outputvectorsize(),
                                                                  "SimpleRNN", layer.name(), "WeightMatrix"));

    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                                                  params.outputvectorsize(), "SimpleRNN",
                                                                  layer.name(), "RecursionMatrix"));

    // bias
    if (hasBiasVector){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                                                      "SimpleRNN", layer.name(), "BiasVector"));
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}